

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.cpp
# Opt level: O2

int __thiscall argparser::getopt(argparser *this,int ___argc,char **___argv,char *__shortopts)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  undefined4 in_register_00000034;
  string *psVar5;
  char **ppcVar6;
  string arg;
  string local_50 [32];
  
  psVar5 = (string *)CONCAT44(in_register_00000034,___argc);
  if ((long)(this->argv).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->argv).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)this->optind) {
    return -1;
  }
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&arg);
  iVar4 = -1;
  if ((*arg._M_dataplus._M_p == '-') && (arg._M_string_length != 1)) {
    this->optind = this->optind + 1;
    iVar1 = std::__cxx11::string::compare((ulong)&arg,0,(char *)0x2);
    if (iVar1 == 0) {
      if (arg._M_string_length != 2) {
        iVar4 = 0x3f;
        for (ppcVar6 = ___argv + 3; ppcVar6[-3] != (char *)0x0; ppcVar6 = ppcVar6 + 4) {
          iVar1 = std::__cxx11::string::compare((ulong)&arg,2,(char *)0xffffffffffffffff);
          if (iVar1 == 0) {
            iVar4 = *(int *)ppcVar6;
            if (*(int *)(ppcVar6 + -2) != 0) {
              if ((ulong)this->optind <
                  (ulong)((long)(this->argv).
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->argv).
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                this->optind = this->optind + 1;
                std::__cxx11::string::_M_assign((string *)this);
                pcVar3 = (this->optarg)._M_dataplus._M_p;
                if (*pcVar3 != '-') goto LAB_00152545;
              }
              else {
                pcVar3 = (this->optarg)._M_dataplus._M_p;
              }
              (this->optarg)._M_string_length = 0;
              *pcVar3 = '\0';
              this->optind = this->optind - 1;
              if (*(int *)(ppcVar6 + -2) == 1) {
                iVar4 = 0x3a;
              }
            }
LAB_00152545:
            if ((int *)ppcVar6[-1] != (int *)0x0) {
              *(int *)ppcVar6[-1] = *(int *)ppcVar6;
              iVar4 = 0;
            }
            break;
          }
        }
      }
    }
    else {
      iVar4 = 0x3f;
      if ((psVar5 != (string *)0x0) &&
         (iVar1 = std::__cxx11::string::compare((ulong)&arg,0,(char *)0x1), iVar1 == 0)) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&arg);
        uVar2 = std::__cxx11::string::find(psVar5,(ulong)local_50);
        std::__cxx11::string::~string(local_50);
        if (uVar2 != 0xffffffffffffffff) {
          iVar4 = (int)*(char *)(*(long *)psVar5 + uVar2);
          if ((uVar2 < *(ulong *)(psVar5 + 8)) &&
             ((*(byte *)(uVar2 + 1 + *(long *)psVar5) & 0xfe) == 0x3a)) {
            if ((ulong)this->optind <
                (ulong)((long)(this->argv).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->argv).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
              this->optind = this->optind + 1;
              std::__cxx11::string::_M_assign((string *)this);
              pcVar3 = (this->optarg)._M_dataplus._M_p;
              if (*pcVar3 != '-') goto LAB_00152577;
            }
            else {
              pcVar3 = (this->optarg)._M_dataplus._M_p;
            }
            (this->optarg)._M_string_length = 0;
            *pcVar3 = '\0';
            this->optind = this->optind - 1;
            if (*(char *)(*(long *)psVar5 + 1 + uVar2) == ':') {
              iVar4 = 0x3a;
            }
          }
        }
      }
    }
  }
LAB_00152577:
  std::__cxx11::string::~string((string *)&arg);
  return iVar4;
}

Assistant:

int
argparser::getopt(string* shortopts, const struct option* longopts,
                  int* /*longindex*/)
{
    if (optind == argv.size())
        return -1;

    string arg;
    arg = argv[optind];
    if (arg[0] != '-' || (arg[0] == '-' && arg.size() == 1))
        return -1;
    optind++;

    int retval = '?';
    if (arg.compare(0, 2, "--") == 0) {
        if (arg.size() == 2) return -1; // " -- " separates options and files
        const struct option* opt = longopts;
        while (opt->name != nullptr) {
            if (arg.compare(2, string::npos, opt->name) == 0) {
                retval = opt->val;
                if (opt->has_arg != option::no_argument) {
                    if (optind >= argv.size() || (optarg = argv[optind++])[0] == '-') {
                        optarg.clear();
                        optind--;
                        if (opt->has_arg == option::required_argument)
                            retval = ':';
                    }
                }
                if (opt->flag != nullptr) {
                    *opt->flag = opt->val;
                    retval = 0;
                }
                break;
            }
            opt++;
        }
    } else if (shortopts != nullptr && arg.compare(0, 1, "-") == 0) {
        size_t pos = shortopts->find(arg.substr(1, 1));
        if (pos != string::npos) {
            retval = (*shortopts)[pos];
            if (pos < shortopts->length()
                && ((*shortopts)[++pos] == ':' || (*shortopts)[pos] == ';')) {
                if (optind >= argv.size() || (optarg = argv[optind++])[0] == '-') {
                    optarg.clear();
                    optind--;
                    if ((*shortopts)[pos] == ':') // required argument
                    retval = ':';
                }
            }
        }
    }

    return retval;
}